

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O1

_Bool string_loop(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  uint uVar1;
  gravity_object_t *closure;
  gravity_class_t *pgVar2;
  _Bool _Var3;
  gravity_fiber_t *fiber;
  nanotime_t nVar4;
  nanotime_t nVar5;
  ulong uVar6;
  gravity_value_t gVar7;
  gravity_value_t gVar8;
  char _buffer [4096];
  gravity_value_t local_1038;
  undefined4 uStack_1028;
  undefined3 uStack_1024;
  undefined5 uStack_1021;
  undefined3 uStack_101c;
  
  if (nargs < 2) {
    uStack_1028 = 0x20666f20;
    uStack_1024 = 0x677261;
    uStack_1021 = 0x746e656d75;
    uStack_101c = 0x2e73;
    local_1038.isa._0_1_ = 'I';
    local_1038.isa._1_1_ = 'n';
    local_1038.isa._2_1_ = 'c';
    local_1038.isa._3_1_ = 'o';
    local_1038.isa._4_1_ = 'r';
    local_1038.isa._5_1_ = 'r';
    local_1038.isa._6_1_ = 'e';
    local_1038.isa._7_1_ = 'c';
    local_1038.field_1._0_1_ = 't';
    local_1038.field_1._1_1_ = ' ';
    local_1038.field_1._2_1_ = 'n';
    local_1038.field_1._3_1_ = 'u';
    local_1038.field_1._4_1_ = 'm';
    local_1038.field_1._5_1_ = 'b';
    local_1038.field_1._6_1_ = 'e';
    local_1038.field_1._7_1_ = 'r';
  }
  else {
    if (args[1].isa == gravity_class_closure) {
      closure = args[1].field_1.p;
      gVar7 = *args;
      pgVar2 = ((args->field_1).p)->objclass;
      uVar1 = *(uint *)((long)&((args->field_1).p)->identifier + 4);
      uVar6 = 0;
      nVar4 = nanotime();
      do {
        if (uVar1 <= uVar6) {
          nVar5 = nanotime();
          gVar7.field_1.p = (gravity_object_t *)(nVar5 - nVar4);
          gVar7.isa = gravity_class_int;
          gravity_vm_setslot(vm,gVar7,rindex);
          return true;
        }
        gVar8 = gravity_string_to_value(vm,(char *)((long)&pgVar2->isa + uVar6),1);
        local_1038.isa._0_4_ = gVar8.isa._0_4_;
        local_1038.isa._4_4_ = gVar8.isa._4_4_;
        local_1038.field_1.n._0_4_ = gVar8.field_1._0_4_;
        local_1038.field_1.n._4_4_ = gVar8.field_1._4_4_;
        _Var3 = gravity_vm_runclosure(vm,(gravity_closure_t *)closure,gVar7,&local_1038,1);
        uVar6 = uVar6 + 1;
      } while (_Var3);
      return false;
    }
    uStack_1028 = 0x43206120;
    uStack_1024 = 0x736f6c;
    uStack_1021 = 0x2e657275;
    local_1038.isa._0_1_ = 'A';
    local_1038.isa._1_1_ = 'r';
    local_1038.isa._2_1_ = 'g';
    local_1038.isa._3_1_ = 'u';
    local_1038.isa._4_1_ = 'm';
    local_1038.isa._5_1_ = 'e';
    local_1038.isa._6_1_ = 'n';
    local_1038.isa._7_1_ = 't';
    local_1038.field_1._0_1_ = ' ';
    local_1038.field_1._1_1_ = 'm';
    local_1038.field_1._2_1_ = 'u';
    local_1038.field_1._3_1_ = 's';
    local_1038.field_1._4_1_ = 't';
    local_1038.field_1._5_1_ = ' ';
    local_1038.field_1._6_1_ = 'b';
    local_1038.field_1._7_1_ = 'e';
  }
  fiber = gravity_vm_fiber(vm);
  gravity_fiber_seterror(fiber,(char *)&local_1038);
  gVar8.field_1.n = 0;
  gVar8.isa = gravity_class_null;
  gravity_vm_setslot(vm,gVar8,rindex);
  return false;
}

Assistant:

static bool string_loop (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    if (nargs < 2) RETURN_ERROR("Incorrect number of arguments.");
    if (!VALUE_ISA_CLOSURE(GET_VALUE(1))) RETURN_ERROR("Argument must be a Closure.");

    gravity_closure_t *closure = VALUE_AS_CLOSURE(GET_VALUE(1));    // closure to execute
    gravity_value_t value = GET_VALUE(0);                            // self parameter
    gravity_string_t *string = VALUE_AS_STRING(value);
    char *str = string->s;
    register gravity_int_t n = string->len;  // Times to execute the loop
    register gravity_int_t i = 0;

    nanotime_t t1 = nanotime();
    while (i < n) {
        gravity_value_t v_str = VALUE_FROM_STRING(vm, str + i, 1);
        if (!gravity_vm_runclosure(vm, closure, value, &v_str, 1)) return false;
        ++i;
    }
    nanotime_t t2 = nanotime();
    RETURN_VALUE(VALUE_FROM_INT(t2-t1), rindex);
}